

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9_header_parser.cc
# Opt level: O3

int __thiscall vp9_parser::Vp9HeaderParser::ReadBit(Vp9HeaderParser *this)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = this->bit_offset_;
  uVar2 = 0;
  if (uVar1 >> 3 < this->frame_size_) {
    uVar2 = (uint)((this->frame_[uVar1 >> 3] >> (~(byte)uVar1 & 7) & 1) != 0);
    this->bit_offset_ = uVar1 + 1;
  }
  return uVar2;
}

Assistant:

int Vp9HeaderParser::ReadBit() {
  const size_t off = bit_offset_;
  const size_t byte_offset = off >> 3;
  const int bit_shift = 7 - static_cast<int>(off & 0x7);
  if (byte_offset < frame_size_) {
    const int bit = (frame_[byte_offset] >> bit_shift) & 1;
    bit_offset_++;
    return bit;
  } else {
    return 0;
  }
}